

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void * list_insert(list *list,void *data)

{
  list_item *plVar1;
  
  plVar1 = (list_item *)malloc(0x10);
  if (plVar1 != (list_item *)0x0) {
    plVar1->data = data;
    plVar1->next = list->head;
    if (list->tail == (list_item *)0x0) {
      list->tail = plVar1;
    }
    list->head = plVar1;
  }
  return plVar1;
}

Assistant:

void *list_insert(struct list *list, void *data)
{
    struct list_item *item = malloc(sizeof(struct list_item));
    if (item == NULL) {
        return NULL;
    }

    item->data = data;
    item->next = list->head;

    if (list->tail == NULL) {
        list->tail = item;
    }

    list->head = item;

    return item;
}